

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

int Ssw_SecGeneral(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Ssw_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  Aig_Man_t *p;
  abctime aVar4;
  char *format;
  int level;
  
  pAVar3 = pAig1;
  aVar2 = Abc_Clock();
  Abc_Print((int)pAVar3,"Performing general verification without node pairs.\n");
  pAVar3 = Saig_ManCreateMiter(pAig1,pAig2,0);
  Aig_ManCleanup(pAVar3);
  p = Ssw_SignalCorrespondence(pAVar3,pPars);
  Aig_ManStop(pAVar3);
  pAVar3 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  level = (int)pAVar3;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(level,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)(pAig2->nRegs + pAig1->nRegs));
      goto LAB_00569d7f;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(level,format);
LAB_00569d7f:
  Abc_Print(level,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecGeneral( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes, * pMiter;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pMiter = Saig_ManCreateMiter( pAig1, pAig2, 0 );
    Aig_ManCleanup( pMiter );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    Aig_ManStop( pMiter );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig1) + Aig_ManRegNum(pAig2) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}